

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O2

void write_value_table(double *values,double *space_coordinates,uint space_nodes,char *filename)

{
  size_t sVar1;
  ulong uVar2;
  char iteration_buffer [32];
  char values_to_string [131072];
  
  memset(values_to_string,0,0x20000);
  iteration_buffer[0x10] = '\0';
  iteration_buffer[0x11] = '\0';
  iteration_buffer[0x12] = '\0';
  iteration_buffer[0x13] = '\0';
  iteration_buffer[0x14] = '\0';
  iteration_buffer[0x15] = '\0';
  iteration_buffer[0x16] = '\0';
  iteration_buffer[0x17] = '\0';
  iteration_buffer[0x18] = '\0';
  iteration_buffer[0x19] = '\0';
  iteration_buffer[0x1a] = '\0';
  iteration_buffer[0x1b] = '\0';
  iteration_buffer[0x1c] = '\0';
  iteration_buffer[0x1d] = '\0';
  iteration_buffer[0x1e] = '\0';
  iteration_buffer[0x1f] = '\0';
  iteration_buffer[0] = '\0';
  iteration_buffer[1] = '\0';
  iteration_buffer[2] = '\0';
  iteration_buffer[3] = '\0';
  iteration_buffer[4] = '\0';
  iteration_buffer[5] = '\0';
  iteration_buffer[6] = '\0';
  iteration_buffer[7] = '\0';
  iteration_buffer[8] = '\0';
  iteration_buffer[9] = '\0';
  iteration_buffer[10] = '\0';
  iteration_buffer[0xb] = '\0';
  iteration_buffer[0xc] = '\0';
  iteration_buffer[0xd] = '\0';
  iteration_buffer[0xe] = '\0';
  iteration_buffer[0xf] = '\0';
  for (uVar2 = 0; space_nodes != uVar2; uVar2 = uVar2 + 1) {
    snprintf(iteration_buffer,0x20,"%.6lf %.6lf\n",SUB84(space_coordinates[uVar2],0),values[uVar2]);
    sVar1 = strlen(values_to_string);
    strncat(values_to_string,iteration_buffer,0x1ffff - sVar1);
  }
  rewrite_file(filename,values_to_string);
  return;
}

Assistant:

void write_value_table (double const * values,
                        double const * space_coordinates,
                        unsigned space_nodes,
                        char * filename) {

  char values_to_string[MAX_BUFFER_SIZE] = "";

  char iteration_buffer[SMALL_BUFFER_SIZE] = "";

  unsigned space_step = 0;

  for (space_step = 0; space_step < space_nodes; ++space_step) {
    snprintf (iteration_buffer, 
              SMALL_BUFFER_SIZE, 
              "%.6lf %.6lf\n", 
              space_coordinates[space_step], 
              values[space_step]);
    strncat (values_to_string, iteration_buffer, MAX_BUFFER_SIZE - strlen(values_to_string) - 1);
  }

  rewrite_file (filename, values_to_string);
  return;
}